

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O2

bool ON_ReparameterizeRationalNurbsCurve
               (double c,int dim,int order,int cv_count,int cvstride,double *cv,double *knot)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  ulong uVar4;
  double *pdVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  double x;
  double dVar12;
  double dVar13;
  
  bVar3 = ON_IsValid(c);
  if (bVar3) {
    x = c + -1.0;
    bVar3 = ON_IsValid(x);
    if (c != 0.0 && bVar3) {
      if ((c != 1.0) || (NAN(c))) {
        iVar6 = order + -2;
        dVar1 = knot[iVar6];
        dVar2 = knot[(long)cv_count + -1];
        dVar12 = dVar2 - dVar1;
        bVar3 = ON_IsValid(dVar12);
        if (!bVar3) {
          return false;
        }
        if (dVar12 <= 0.0) {
          return false;
        }
        uVar4 = 0;
        uVar7 = (ulong)(uint)(iVar6 + cv_count);
        if (iVar6 + cv_count < 1) {
          uVar7 = uVar4;
        }
        for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
          dVar13 = (knot[uVar4] - dVar1) * (1.0 / dVar12);
          knot[uVar4] = (dVar13 * c) / (x * dVar13 + 1.0);
        }
        iVar9 = 0;
        iVar8 = cv_count;
        if (cv_count < 1) {
          iVar8 = 0;
        }
        pdVar5 = knot + -(long)cv_count;
        for (; iVar9 != iVar8; iVar9 = iVar9 + 1) {
          dVar12 = *knot * -x + c;
          lVar10 = (long)iVar6;
          while (lVar10 != 0) {
            dVar12 = dVar12 * (knot[lVar10] * -x + c);
            lVar10 = lVar10 + -1;
          }
          dVar13 = cv[dim];
          lVar10 = ~(long)(~dim + cvstride) << 3;
          for (lVar11 = 0; dim != (int)lVar11; lVar11 = lVar11 + 1) {
            cv[lVar11] = cv[lVar11] * dVar12;
            lVar10 = lVar10 + -8;
          }
          cv[lVar11] = dVar12 * dVar13;
          cv = (double *)((long)cv - lVar10);
          pdVar5 = pdVar5 + 1;
          knot = knot + 1;
        }
        while (bVar3 = uVar7 != 0, uVar7 = uVar7 - 1, bVar3) {
          *pdVar5 = (1.0 - *pdVar5) * dVar1 + *pdVar5 * dVar2;
          pdVar5 = pdVar5 + 1;
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_ReparameterizeRationalNurbsCurve(
          double c, 
          int dim, 
          int order, 
          int cv_count,
          int cvstride,
          double* cv,
          double* knot
          )
{
  // Reference
  //  E. T. Y. Lee and M. L. Lucian 
  //  Mobius reparameterization of rational B-splines
  //  CAGD Vol8 pp 213-215 1991
  const double c1 = c-1.0;
  double k0, k1, k, d, w0, w1;
  int i,j;

  if ( !ON_IsValid(c) || !ON_IsValid(c1) || 0.0 == c )
    return false;

  if ( 1.0 == c )
    return true;

  // change domain to [0,1] and then adjust knots
  k0 = knot[order-2];
  k1 = knot[cv_count-1];
  d = k1 - k0;
  if ( !ON_IsValid(d) || d <= 0.0 )
    return false;
  d = 1.0/d;
  j = cv_count+order-2;
  for ( i = 0; i < j; i++ )
  {
    k = knot[i];
    k = (k - k0)*d;
    knot[i] = c*k/(c1*k+1.0);
  }

  // adjust cvs
  order -= 2;
  cvstride -= (dim+1);
  for ( i = 0; i < cv_count; i++ )
  {
    d = c - c1*(*knot++);
    j = order;
    while(j--)
    {
      d *= c - c1*knot[j];
    }
    w0 = cv[dim];
    w1 = w0*d;
    j = dim;
    while(j--)
      *cv++ *= d;
    *cv++ = w1;
    cv += cvstride;
  }
  order += 2;
  cvstride += (dim+1);
  cv -= cv_count*cvstride;
  knot -= cv_count;

  // change domain back to [k0,k1]
  j = cv_count+order-2;
  for ( i = 0; i < j; i++ )
  {
    k = knot[i];
    knot[i] = (1.0-k)*k0 + k*k1;
  }

  return true;
}